

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int bgzf_mt(BGZF *fp,int n_threads,int n_sub_blks)

{
  ulong __nmemb;
  int iVar1;
  bgzf_mtaux_t *pbVar2;
  int *piVar3;
  void **ppvVar4;
  void *pvVar5;
  pthread_t *ppVar6;
  worker_t *pwVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  pthread_attr_t attr;
  pthread_attr_t local_68;
  
  iVar1 = -1;
  if ((((fp->field_0x2 & 3) != 0) && (__nmemb = (ulong)(uint)n_threads, iVar1 = -1, 1 < n_threads))
     && (fp->mt == (bgzf_mtaux_t *)0x0)) {
    pbVar2 = (bgzf_mtaux_t *)calloc(1,0x90);
    pbVar2->n_threads = n_threads;
    uVar10 = n_sub_blks * n_threads;
    pbVar2->n_blks = uVar10;
    piVar3 = (int *)calloc((long)(int)uVar10,4);
    pbVar2->len = piVar3;
    ppvVar4 = (void **)calloc((long)(int)uVar10,8);
    pbVar2->blk = ppvVar4;
    if (0 < (int)uVar10) {
      uVar11 = 0;
      do {
        pvVar5 = malloc(0x10000);
        pbVar2->blk[uVar11] = pvVar5;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    ppVar6 = (pthread_t *)calloc(__nmemb,8);
    pbVar2->tid = ppVar6;
    pwVar7 = (worker_t *)calloc(__nmemb,0x20);
    pbVar2->w = pwVar7;
    if (0 < n_threads) {
      iVar1 = *(int *)fp;
      uVar11 = 0;
      do {
        pwVar7->i = (int)uVar11;
        pwVar7->mt = pbVar2;
        pwVar7->compress_level = (iVar1 << 3) >> 0x17;
        pvVar5 = malloc(0x10000);
        pwVar7->buf = pvVar5;
        uVar11 = uVar11 + 1;
        pwVar7 = pwVar7 + 1;
      } while (__nmemb != uVar11);
    }
    pthread_attr_init(&local_68);
    pthread_attr_setdetachstate(&local_68,0);
    pthread_mutex_init((pthread_mutex_t *)&pbVar2->lock,(pthread_mutexattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&pbVar2->cv,(pthread_condattr_t *)0x0);
    if (1 < pbVar2->n_threads) {
      lVar9 = 1;
      lVar8 = 0x20;
      lVar12 = 8;
      do {
        pthread_create((pthread_t *)((long)pbVar2->tid + lVar12),&local_68,mt_worker,
                       (void *)((long)&pbVar2->w->mt + lVar8));
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x20;
        lVar12 = lVar12 + 8;
      } while (lVar9 < pbVar2->n_threads);
    }
    fp->mt = pbVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int bgzf_mt(BGZF *fp, int n_threads, int n_sub_blks)
{
    int i;
    mtaux_t *mt;
    pthread_attr_t attr;
    if (!fp->is_write || fp->mt || n_threads <= 1) return -1;
    mt = (mtaux_t*)calloc(1, sizeof(mtaux_t));
    mt->n_threads = n_threads;
    mt->n_blks = n_threads * n_sub_blks;
    mt->len = (int*)calloc(mt->n_blks, sizeof(int));
    mt->blk = (void**)calloc(mt->n_blks, sizeof(void*));
    for (i = 0; i < mt->n_blks; ++i)
        mt->blk[i] = malloc(BGZF_MAX_BLOCK_SIZE);
    mt->tid = (pthread_t*)calloc(mt->n_threads, sizeof(pthread_t)); // tid[0] is not used, as the worker 0 is launched by the master
    mt->w = (worker_t*)calloc(mt->n_threads, sizeof(worker_t));
    for (i = 0; i < mt->n_threads; ++i) {
        mt->w[i].i = i;
        mt->w[i].mt = mt;
        mt->w[i].compress_level = fp->compress_level;
        mt->w[i].buf = malloc(BGZF_MAX_BLOCK_SIZE);
    }
    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);
    pthread_mutex_init(&mt->lock, 0);
    pthread_cond_init(&mt->cv, 0);
    for (i = 1; i < mt->n_threads; ++i) // worker 0 is effectively launched by the master thread
        pthread_create(&mt->tid[i], &attr, mt_worker, &mt->w[i]);
    fp->mt = mt;
    return 0;
}